

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::StopTimer(RWSocket *this)

{
  StopTimer((RWSocket *)&this[-1].super_CNSocket);
  return;
}

Assistant:

void RWSocket::StopTimer() {
    if (_timer_id == 0) {
        return;
    }
    
    auto dispatcher = GetDispatcher();
    if (dispatcher) {
        dispatcher->StopTimer(_timer_id);
        _timer_id = 0;
    }
}